

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::StrongWeakPropertyExprSyntax::setChild
          (StrongWeakPropertyExprSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00477cd8 + *(int *)(&DAT_00477cd8 + index * 4)))();
  return;
}

Assistant:

void StrongWeakPropertyExprSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: keyword = child.token(); return;
        case 1: openParen = child.token(); return;
        case 2: expr = child.node() ? &child.node()->as<SequenceExprSyntax>() : nullptr; return;
        case 3: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}